

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O2

int archive_write_zip_header(archive_write *a,archive_entry *entry)

{
  byte *pbVar1;
  char cVar2;
  zip_conflict *zip;
  mode_t mVar3;
  wchar_t wVar4;
  int iVar5;
  mode_t mVar6;
  uint uVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  undefined4 uVar10;
  uchar *pp;
  archive_string_conv *sc;
  int64_t iVar11;
  unsigned_long uVar12;
  archive_entry *paVar13;
  int *piVar14;
  char *pcVar15;
  size_t sVar16;
  undefined1 (*pauVar17) [16];
  uchar *puVar18;
  time_t tVar19;
  uchar *__dest;
  char *pcVar20;
  undefined2 uVar21;
  compression cVar22;
  uchar *external_info;
  uchar uVar23;
  uchar *p_1;
  uchar *puVar24;
  size_t sVar25;
  undefined1 auVar26 [16];
  int local_104;
  char *local_100;
  size_t local_f0;
  size_t len;
  undefined1 local_e0;
  undefined1 local_df;
  uint local_de;
  undefined2 local_da;
  undefined2 uStack_d8;
  undefined4 uStack_d6;
  undefined1 uStack_d2;
  undefined1 uStack_d1;
  undefined1 uStack_d0;
  undefined1 uStack_cf;
  undefined1 uStack_ce;
  undefined1 uStack_cd;
  undefined2 uStack_cc;
  undefined2 uStack_ca;
  int64_t *local_c0;
  uchar local_extra [128];
  
  zip = (zip_conflict *)a->format_data;
  sc = zip->opt_sconv;
  if (sc == (archive_string_conv *)0x0) {
    if (zip->init_default_conversion == 0) {
      sc = archive_string_default_conversion_for_write((archive_conflict *)a);
      zip->sconv_default = sc;
      zip->init_default_conversion = 1;
    }
    else {
      sc = zip->sconv_default;
    }
  }
  mVar3 = archive_entry_filetype(entry);
  if (((mVar3 != 0x4000) && (mVar3 != 0x8000)) && (mVar3 != 0xa000)) {
    pcVar20 = "Filetype not supported";
    goto LAB_00159e09;
  }
  if ((zip->flags & 1) != 0) {
    wVar4 = archive_entry_size_is_set(entry);
    if ((wVar4 != L'\0') && (iVar11 = archive_entry_size(entry), 0xffffffff < iVar11)) {
      pcVar20 = "Files > 4GB require Zip64 extensions";
LAB_00159e09:
      archive_set_error(&a->archive,-1,pcVar20);
      return -0x19;
    }
    if (0xffffffff < zip->written_bytes) {
      pcVar20 = "Archives > 4GB require Zip64 extensions";
      goto LAB_00159e09;
    }
  }
  if (mVar3 != 0x8000) {
    archive_entry_set_size(entry,0);
  }
  zip->entry_offset = zip->written_bytes;
  zip->entry_uncompressed_limit = 0x7fffffffffffffff;
  zip->entry_flags = 0;
  zip->entry_uses_zip64 = 0;
  zip->entry_compressed_size = 0;
  zip->entry_uncompressed_size = 0;
  zip->entry_compressed_written = 0;
  zip->entry_uncompressed_written = 0;
  uVar12 = (*zip->crc32func)(0,(void *)0x0,0);
  zip->entry_crc32 = (uint32_t)uVar12;
  if (zip->entry != (archive_entry *)0x0) {
    archive_entry_free(zip->entry);
    zip->entry = (archive_entry *)0x0;
  }
  paVar13 = archive_entry_clone(entry);
  zip->entry = paVar13;
  if (paVar13 != (archive_entry *)0x0) {
    if (sc == (archive_string_conv *)0x0) {
      local_104 = 0;
    }
    else {
      wVar4 = _archive_entry_pathname_l(entry,(char **)local_extra,&len,sc);
      if (wVar4 == L'\0') {
        local_104 = 0;
      }
      else {
        piVar14 = __errno_location();
        if (*piVar14 == 0xc) {
          pcVar20 = "Can\'t allocate memory for Pathname";
          goto LAB_00159e21;
        }
        pcVar20 = archive_entry_pathname(entry);
        pcVar15 = archive_string_conversion_charset_name(sc);
        archive_set_error(&a->archive,0x54,"Can\'t translate Pathname \'%s\' to %s",pcVar20,pcVar15)
        ;
        local_104 = -0x14;
      }
      if (CONCAT17(len._7_1_,
                   CONCAT16(len._6_1_,CONCAT15(len._5_1_,CONCAT14(len._4_1_,(undefined4)len)))) != 0
         ) {
        archive_entry_set_pathname(zip->entry,(char *)local_extra._0_8_);
      }
      if (mVar3 == 0xa000) {
        wVar4 = _archive_entry_symlink_l(entry,(char **)local_extra,&len,sc);
        if (wVar4 == L'\0') {
          if (CONCAT17(len._7_1_,
                       CONCAT16(len._6_1_,CONCAT15(len._5_1_,CONCAT14(len._4_1_,(undefined4)len))))
              != 0) {
            archive_entry_set_symlink(zip->entry,(char *)local_extra._0_8_);
          }
        }
        else {
          piVar14 = __errno_location();
          if (*piVar14 == 0xc) {
            pcVar20 = "Can\'t allocate memory  for Symlink";
            goto LAB_00159e21;
          }
        }
      }
      paVar13 = zip->entry;
    }
    local_c0 = &zip->entry_compressed_size;
    pcVar20 = archive_entry_pathname(paVar13);
    do {
      cVar2 = *pcVar20;
      if (cVar2 == '\0') goto LAB_00159f40;
      pcVar20 = pcVar20 + 1;
    } while (-1 < cVar2);
    if (zip->opt_sconv == (archive_string_conv *)0x0) {
      pcVar20 = nl_langinfo(0xe);
    }
    else {
      pcVar20 = archive_string_conversion_charset_name(zip->opt_sconv);
    }
    iVar5 = strcmp(pcVar20,"UTF-8");
    if (iVar5 == 0) {
      pbVar1 = (byte *)((long)&zip->entry_flags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
LAB_00159f40:
    paVar13 = zip->entry;
    mVar6 = archive_entry_filetype(paVar13);
    pcVar20 = archive_entry_pathname(paVar13);
    if (pcVar20 == (char *)0x0) {
      sVar16 = 0;
    }
    else if ((mVar6 == 0x4000) &&
            ((*pcVar20 == '\0' || (sVar16 = strlen(pcVar20), pcVar20[sVar16 - 1] != '/')))) {
      sVar16 = strlen(pcVar20);
      sVar16 = sVar16 + 1;
    }
    else {
      sVar16 = strlen(pcVar20);
    }
    if (mVar3 == 0xa000) {
      local_100 = archive_entry_symlink(zip->entry);
      uVar21 = 0;
      if (local_100 == (char *)0x0) {
        local_f0 = 0;
      }
      else {
        local_f0 = strlen(local_100);
      }
      zip->entry_uncompressed_limit = local_f0;
      zip->entry_compressed_size = local_f0;
      zip->entry_uncompressed_size = local_f0;
      uVar12 = (*zip->crc32func)((unsigned_long)zip->entry_crc32,local_100,local_f0);
      zip->entry_crc32 = (uint32_t)uVar12;
      zip->entry_compression = COMPRESSION_STORE;
      uVar23 = '\x14';
    }
    else {
      if (mVar3 == 0x8000) {
        wVar4 = archive_entry_size_is_set(zip->entry);
        cVar22 = COMPRESSION_DEFLATE;
        if (wVar4 == L'\0') {
          zip->entry_compression = COMPRESSION_DEFLATE;
          *(byte *)&zip->entry_flags = (byte)zip->entry_flags | 8;
          if ((zip->flags & 1) == 0) {
            zip->entry_uses_zip64 = 1;
            uVar23 = '-';
          }
          else {
            uVar23 = '\x14';
          }
        }
        else {
          iVar11 = archive_entry_size(zip->entry);
          zip->entry_uncompressed_limit = iVar11;
          cVar22 = COMPRESSION_DEFLATE;
          if (zip->requested_compression != COMPRESSION_UNSPECIFIED) {
            cVar22 = zip->requested_compression;
          }
          zip->entry_compression = cVar22;
          uVar23 = '\x14';
          if (cVar22 == COMPRESSION_STORE) {
            *local_c0 = iVar11;
            uVar23 = '\n';
          }
          zip->entry_uncompressed_size = iVar11;
          if ((byte)(0xffffffff < iVar11 | ((byte)zip->flags & 2) >> 1) == 1) {
            zip->entry_uses_zip64 = 1;
            uVar23 = '-';
          }
          *(byte *)&zip->entry_flags = (byte)zip->entry_flags | 8;
        }
      }
      else {
        zip->entry_compression = COMPRESSION_STORE;
        zip->entry_uncompressed_limit = 0;
        uVar23 = '\x14';
        cVar22 = COMPRESSION_STORE;
      }
      uVar21 = (undefined2)cVar22;
      local_f0 = 0;
      local_100 = (char *)0x0;
    }
    uStack_d8 = 0;
    uStack_d6 = 0;
    uStack_d2 = 0;
    uStack_d1 = 0;
    uStack_d0 = 0;
    uStack_cf = 0;
    uStack_ce = 0;
    uStack_cd = 0;
    uStack_cc = 0;
    uStack_ca = 0;
    len._0_4_ = 0x4034b50;
    len._5_1_ = 0;
    len._6_1_ = (undefined1)zip->entry_flags;
    len._7_1_ = (undefined1)((uint)zip->entry_flags >> 8);
    local_e0 = (undefined1)uVar21;
    local_df = (undefined1)((ushort)uVar21 >> 8);
    len._4_1_ = uVar23;
    archive_entry_mtime(zip->entry);
    local_de = dos_time(0x15a0e4);
    local_da = (undefined2)zip->entry_crc32;
    uStack_d8 = (undefined2)(zip->entry_crc32 >> 0x10);
    if (zip->entry_uses_zip64 == 0) {
      uStack_d6 = (undefined4)zip->entry_compressed_size;
      iVar11 = zip->entry_uncompressed_size;
      uStack_d1 = (undefined1)((ulong)iVar11 >> 8);
      uStack_d0 = (undefined1)((ulong)iVar11 >> 0x10);
      uStack_cf = (undefined1)((ulong)iVar11 >> 0x18);
    }
    else {
      uStack_d6 = 0xffffffff;
      iVar11 = 0xff;
      uStack_d1 = 0xff;
      uStack_d0 = 0xff;
      uStack_cf = 0xff;
    }
    uStack_d2 = (undefined1)iVar11;
    uStack_ce = (undefined1)sVar16;
    uStack_cd = (undefined1)(sVar16 >> 8);
    pauVar17 = (undefined1 (*) [16])cd_alloc(zip,0x2e);
    zip->file_header = (uchar *)pauVar17;
    zip->central_directory_entries = zip->central_directory_entries + 1;
    *pauVar17 = (undefined1  [16])0x0;
    pauVar17[1] = (undefined1  [16])0x0;
    *(undefined1 (*) [16])(pauVar17[1] + 0xe) = (undefined1  [16])0x0;
    builtin_memcpy(zip->file_header,"PK\x01\x02",4);
    puVar18 = zip->file_header;
    puVar18[4] = uVar23;
    puVar18[5] = '\x03';
    puVar18 = zip->file_header;
    local_c0 = (int64_t *)CONCAT71(local_c0._1_7_,uVar23);
    puVar18[6] = uVar23;
    puVar18[7] = '\0';
    *(short *)(zip->file_header + 8) = (short)zip->entry_flags;
    *(short *)(zip->file_header + 10) = (short)zip->entry_compression;
    puVar18 = zip->file_header;
    archive_entry_mtime(zip->entry);
    uVar7 = dos_time(0x15a1bf);
    *(uint *)(puVar18 + 0xc) = uVar7;
    *(short *)(zip->file_header + 0x1c) = (short)sVar16;
    puVar18 = zip->file_header;
    mVar3 = archive_entry_mode(zip->entry);
    puVar18[0x26] = '\0';
    puVar18[0x27] = '\0';
    puVar18[0x28] = (uchar)mVar3;
    puVar18[0x29] = (uchar)(mVar3 >> 8);
    puVar18 = cd_alloc(zip,sVar16);
    paVar13 = zip->entry;
    pcVar20 = archive_entry_pathname(paVar13);
    sVar16 = strlen(pcVar20);
    mVar3 = archive_entry_filetype(paVar13);
    memcpy(puVar18,pcVar20,sVar16);
    if ((mVar3 == 0x4000) && (pcVar20[sVar16 - 1] != '/')) {
      (puVar18 + sVar16)[0] = '/';
      (puVar18 + sVar16)[1] = '\0';
    }
    local_extra[0x70] = '\0';
    local_extra[0x71] = '\0';
    local_extra[0x72] = '\0';
    local_extra[0x73] = '\0';
    local_extra[0x74] = '\0';
    local_extra[0x75] = '\0';
    local_extra[0x76] = '\0';
    local_extra[0x77] = '\0';
    local_extra[0x78] = '\0';
    local_extra[0x79] = '\0';
    local_extra[0x7a] = '\0';
    local_extra[0x7b] = '\0';
    local_extra[0x7c] = '\0';
    local_extra[0x7d] = '\0';
    local_extra[0x7e] = '\0';
    local_extra[0x7f] = '\0';
    local_extra[0x60] = '\0';
    local_extra[0x61] = '\0';
    local_extra[0x62] = '\0';
    local_extra[99] = '\0';
    local_extra[100] = '\0';
    local_extra[0x65] = '\0';
    local_extra[0x66] = '\0';
    local_extra[0x67] = '\0';
    local_extra[0x68] = '\0';
    local_extra[0x69] = '\0';
    local_extra[0x6a] = '\0';
    local_extra[0x6b] = '\0';
    local_extra[0x6c] = '\0';
    local_extra[0x6d] = '\0';
    local_extra[0x6e] = '\0';
    local_extra[0x6f] = '\0';
    local_extra[0x50] = '\0';
    local_extra[0x51] = '\0';
    local_extra[0x52] = '\0';
    local_extra[0x53] = '\0';
    local_extra[0x54] = '\0';
    local_extra[0x55] = '\0';
    local_extra[0x56] = '\0';
    local_extra[0x57] = '\0';
    local_extra[0x58] = '\0';
    local_extra[0x59] = '\0';
    local_extra[0x5a] = '\0';
    local_extra[0x5b] = '\0';
    local_extra[0x5c] = '\0';
    local_extra[0x5d] = '\0';
    local_extra[0x5e] = '\0';
    local_extra[0x5f] = '\0';
    local_extra[0x40] = '\0';
    local_extra[0x41] = '\0';
    local_extra[0x42] = '\0';
    local_extra[0x43] = '\0';
    local_extra[0x44] = '\0';
    local_extra[0x45] = '\0';
    local_extra[0x46] = '\0';
    local_extra[0x47] = '\0';
    local_extra[0x48] = '\0';
    local_extra[0x49] = '\0';
    local_extra[0x4a] = '\0';
    local_extra[0x4b] = '\0';
    local_extra[0x4c] = '\0';
    local_extra[0x4d] = '\0';
    local_extra[0x4e] = '\0';
    local_extra[0x4f] = '\0';
    local_extra[0x30] = '\0';
    local_extra[0x31] = '\0';
    local_extra[0x32] = '\0';
    local_extra[0x33] = '\0';
    local_extra[0x34] = '\0';
    local_extra[0x35] = '\0';
    local_extra[0x36] = '\0';
    local_extra[0x37] = '\0';
    local_extra[0x38] = '\0';
    local_extra[0x39] = '\0';
    local_extra[0x3a] = '\0';
    local_extra[0x3b] = '\0';
    local_extra[0x3c] = '\0';
    local_extra[0x3d] = '\0';
    local_extra[0x3e] = '\0';
    local_extra[0x3f] = '\0';
    local_extra[0x20] = '\0';
    local_extra[0x21] = '\0';
    local_extra[0x22] = '\0';
    local_extra[0x23] = '\0';
    local_extra[0x24] = '\0';
    local_extra[0x25] = '\0';
    local_extra[0x26] = '\0';
    local_extra[0x27] = '\0';
    local_extra[0x28] = '\0';
    local_extra[0x29] = '\0';
    local_extra[0x2a] = '\0';
    local_extra[0x2b] = '\0';
    local_extra[0x2c] = '\0';
    local_extra[0x2d] = '\0';
    local_extra[0x2e] = '\0';
    local_extra[0x2f] = '\0';
    local_extra[0x10] = '\0';
    local_extra[0x11] = '\0';
    local_extra[0x12] = '\0';
    local_extra[0x13] = '\0';
    local_extra[0x14] = '\0';
    local_extra[0x15] = '\0';
    local_extra[0x16] = '\0';
    local_extra[0x17] = '\0';
    local_extra[0x18] = '\0';
    local_extra[0x19] = '\0';
    local_extra[0x1a] = '\0';
    local_extra[0x1b] = '\0';
    local_extra[0x1c] = '\0';
    local_extra[0x1d] = '\0';
    local_extra[0x1e] = '\0';
    local_extra[0x1f] = '\0';
    local_extra._2_14_ = SUB1614((undefined1  [16])0x0,2);
    local_extra[0] = 'U';
    local_extra[1] = 'T';
    wVar4 = archive_entry_mtime_is_set(entry);
    wVar8 = archive_entry_atime_is_set(entry);
    wVar9 = archive_entry_ctime_is_set(entry);
    auVar26 = local_extra._0_16_;
    local_extra[2] =
         (wVar9 != L'\0') * '\x04' + (wVar8 != L'\0') * '\x04' + (wVar4 != L'\0') * '\x04' + '\x01';
    local_extra._4_12_ = auVar26._4_12_;
    local_extra[3] = '\0';
    wVar4 = archive_entry_mtime_is_set(entry);
    wVar8 = archive_entry_atime_is_set(entry);
    wVar9 = archive_entry_ctime_is_set(entry);
    local_extra[4] = (wVar9 != L'\0') << 2 | (wVar8 != L'\0') * '\x02' | wVar4 != L'\0';
    wVar4 = archive_entry_mtime_is_set(entry);
    if (wVar4 == L'\0') {
      puVar18 = local_extra + 5;
    }
    else {
      tVar19 = archive_entry_mtime(entry);
      puVar18 = local_extra + 9;
      uVar10 = (undefined4)tVar19;
      local_extra[5] = (char)uVar10;
      local_extra[6] = (char)((uint)uVar10 >> 8);
      local_extra[7] = (char)((uint)uVar10 >> 0x10);
      local_extra[8] = (char)((uint)uVar10 >> 0x18);
    }
    wVar4 = archive_entry_atime_is_set(entry);
    if (wVar4 != L'\0') {
      tVar19 = archive_entry_atime(entry);
      *(int *)puVar18 = (int)tVar19;
      puVar18 = puVar18 + 4;
    }
    wVar4 = archive_entry_ctime_is_set(entry);
    if (wVar4 != L'\0') {
      tVar19 = archive_entry_ctime(entry);
      *(int *)puVar18 = (int)tVar19;
      puVar18 = puVar18 + 4;
    }
    puVar18[0] = 'u';
    puVar18[1] = 'x';
    puVar18[2] = '\v';
    puVar18[3] = '\0';
    puVar18[4] = '\x01';
    puVar18[5] = '\x04';
    iVar11 = archive_entry_uid(entry);
    puVar18[6] = (uchar)iVar11;
    puVar18[7] = (uchar)((ulong)iVar11 >> 8);
    puVar18[8] = (uchar)((ulong)iVar11 >> 0x10);
    puVar18[9] = (uchar)((ulong)iVar11 >> 0x18);
    puVar18[10] = '\x04';
    iVar11 = archive_entry_gid(entry);
    *(int *)(puVar18 + 0xb) = (int)iVar11;
    puVar24 = puVar18 + 0xf;
    zip->file_header_extra_offset = zip->central_directory_bytes;
    sVar25 = (long)puVar24 - (long)local_extra;
    __dest = cd_alloc(zip,sVar25);
    memcpy(__dest,local_extra,sVar25);
    if (zip->entry_uses_zip64 != 0) {
      puVar18[0xf] = '\x01';
      puVar18[0x10] = '\0';
      puVar18[0x11] = '\x10';
      puVar18[0x12] = '\0';
      archive_le64enc(puVar18 + 0x13,zip->entry_uncompressed_size);
      archive_le64enc(puVar18 + 0x1b,zip->entry_compressed_size);
      puVar18[0x11] = '\x10';
      puVar18[0x12] = '\0';
      puVar24 = puVar18 + 0x23;
    }
    if ((zip->flags & 4) != 0) {
      puVar24[0] = 'e';
      puVar24[1] = 'l';
      puVar24[2] = '\0';
      puVar24[3] = '\0';
      puVar24[4] = '\a';
      puVar24[5] = (uchar)local_c0;
      puVar24[6] = '\x03';
      puVar24[7] = '\0';
      puVar24[8] = '\0';
      mVar3 = archive_entry_mode(zip->entry);
      puVar24[9] = '\0';
      puVar24[10] = '\0';
      puVar24[0xb] = (uchar)mVar3;
      puVar24[0xc] = (uchar)(mVar3 >> 8);
      puVar24[2] = '\t';
      puVar24[3] = '\0';
      puVar24 = puVar24 + 0xd;
    }
    sVar25 = (long)puVar24 - (long)local_extra;
    uStack_cc = (undefined2)sVar25;
    iVar5 = __archive_write_output(a,&len,0x1e);
    if (iVar5 == 0) {
      zip->written_bytes = zip->written_bytes + 0x1e;
      paVar13 = zip->entry;
      pcVar20 = archive_entry_pathname(paVar13);
      mVar3 = archive_entry_filetype(paVar13);
      sVar16 = strlen(pcVar20);
      iVar5 = __archive_write_output(a,pcVar20,sVar16);
      if (iVar5 == 0) {
        sVar16 = strlen(pcVar20);
        if ((mVar3 == 0x4000) && (pcVar20[sVar16 - 1] != '/')) {
          iVar5 = __archive_write_output(a,"/",1);
          if (iVar5 != 0) {
            return -0x1e;
          }
          sVar16 = sVar16 + 1;
        }
        if (0 < (int)(uint)sVar16) {
          zip->written_bytes = zip->written_bytes + (ulong)((uint)sVar16 & 0x7fffffff);
          iVar5 = __archive_write_output(a,local_extra,sVar25);
          if (iVar5 == 0) {
            zip->written_bytes = zip->written_bytes + sVar25;
            if (local_100 != (char *)0x0) {
              iVar5 = __archive_write_output(a,local_100,local_f0);
              if (iVar5 != 0) {
                return -0x1e;
              }
              auVar26._8_4_ = (int)local_f0;
              auVar26._0_8_ = local_f0;
              auVar26._12_4_ = (int)(local_f0 >> 0x20);
              zip->entry_compressed_written = local_f0 + zip->entry_compressed_written;
              zip->entry_uncompressed_written = auVar26._8_8_ + zip->entry_uncompressed_written;
              zip->written_bytes = zip->written_bytes + local_f0;
            }
            if (zip->entry_compression != COMPRESSION_DEFLATE) {
              return local_104;
            }
            (zip->stream).zalloc = (alloc_func)0x0;
            (zip->stream).zfree = (free_func)0x0;
            (zip->stream).opaque = (voidpf)0x0;
            (zip->stream).next_out = zip->buf;
            (zip->stream).avail_out = (uInt)zip->len_buf;
            pcVar20 = "1.2.11";
            iVar5 = deflateInit2_(&zip->stream,0xffffffffffffffff,8,0xfffffffffffffff1,8,0,"1.2.11",
                                  0x70);
            if (iVar5 == 0) {
              return local_104;
            }
            archive_set_error(&a->archive,0xc,"Can\'t init deflate compressor",pcVar20);
          }
        }
      }
    }
    return -0x1e;
  }
  pcVar20 = "Can\'t allocate zip header data";
LAB_00159e21:
  archive_set_error(&a->archive,0xc,pcVar20);
  return -0x1e;
}

Assistant:

static int
archive_write_zip_header(struct archive_write *a, struct archive_entry *entry)
{
	unsigned char local_header[32];
	unsigned char local_extra[128];
	struct zip *zip = a->format_data;
	unsigned char *e;
	unsigned char *cd_extra;
	size_t filename_length;
	const char *slink = NULL;
	size_t slink_size = 0;
	struct archive_string_conv *sconv = get_sconv(a, zip);
	int ret, ret2 = ARCHIVE_OK;
	int64_t size;
	mode_t type;
	int version_needed = 10;

	/* Ignore types of entries that we don't support. */
	type = archive_entry_filetype(entry);
	if (type != AE_IFREG && type != AE_IFDIR && type != AE_IFLNK) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
		    "Filetype not supported");
		return ARCHIVE_FAILED;
	};

	/* If we're not using Zip64, reject large files. */
	if (zip->flags & ZIP_FLAG_AVOID_ZIP64) {
		/* Reject entries over 4GB. */
		if (archive_entry_size_is_set(entry)
		    && (archive_entry_size(entry) > 0xffffffff)) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Files > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
		/* Reject entries if archive is > 4GB. */
		if (zip->written_bytes > 0xffffffff) {
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "Archives > 4GB require Zip64 extensions");
			return ARCHIVE_FAILED;
		}
	}

	/* Only regular files can have size > 0. */
	if (type != AE_IFREG)
		archive_entry_set_size(entry, 0);


	/* Reset information from last entry. */
	zip->entry_offset = zip->written_bytes;
	zip->entry_uncompressed_limit = INT64_MAX;
	zip->entry_compressed_size = 0;
	zip->entry_uncompressed_size = 0;
	zip->entry_compressed_written = 0;
	zip->entry_uncompressed_written = 0;
	zip->entry_flags = 0;
	zip->entry_uses_zip64 = 0;
	zip->entry_crc32 = zip->crc32func(0, NULL, 0);
	if (zip->entry != NULL) {
		archive_entry_free(zip->entry);
		zip->entry = NULL;
	}

#if defined(_WIN32) && !defined(__CYGWIN__)
	/* Make sure the path separators in pahtname, hardlink and symlink
	 * are all slash '/', not the Windows path separator '\'. */
	zip->entry = __la_win_entry_in_posix_pathseparator(entry);
	if (zip->entry == entry)
		zip->entry = archive_entry_clone(entry);
#else
	zip->entry = archive_entry_clone(entry);
#endif
	if (zip->entry == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate zip header data");
		return (ARCHIVE_FATAL);
	}

	if (sconv != NULL) {
		const char *p;
		size_t len;

		if (archive_entry_pathname_l(entry, &p, &len, sconv) != 0) {
			if (errno == ENOMEM) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate memory for Pathname");
				return (ARCHIVE_FATAL);
			}
			archive_set_error(&a->archive,
			    ARCHIVE_ERRNO_FILE_FORMAT,
			    "Can't translate Pathname '%s' to %s",
			    archive_entry_pathname(entry),
			    archive_string_conversion_charset_name(sconv));
			ret2 = ARCHIVE_WARN;
		}
		if (len > 0)
			archive_entry_set_pathname(zip->entry, p);

		/*
		 * There is no standard for symlink handling; we convert
		 * it using the same character-set translation that we use
		 * for filename.
		 */
		if (type == AE_IFLNK) {
			if (archive_entry_symlink_l(entry, &p, &len, sconv)) {
				if (errno == ENOMEM) {
					archive_set_error(&a->archive, ENOMEM,
					    "Can't allocate memory "
					    " for Symlink");
					return (ARCHIVE_FATAL);
				}
				/* No error if we can't convert. */
			} else if (len > 0)
				archive_entry_set_symlink(zip->entry, p);
		}
	}

	/* If filename isn't ASCII and we can use UTF-8, set the UTF-8 flag. */
	if (!is_all_ascii(archive_entry_pathname(zip->entry))) {
		if (zip->opt_sconv != NULL) {
			if (strcmp(archive_string_conversion_charset_name(
					zip->opt_sconv), "UTF-8") == 0)
				zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#if HAVE_NL_LANGINFO
		} else if (strcmp(nl_langinfo(CODESET), "UTF-8") == 0) {
			zip->entry_flags |= ZIP_ENTRY_FLAG_UTF8_NAME;
#endif
		}
	}
	filename_length = path_length(zip->entry);

	/* Determine appropriate compression and size for this entry. */
	if (type == AE_IFLNK) {
		slink = archive_entry_symlink(zip->entry);
		if (slink != NULL)
			slink_size = strlen(slink);
		else
			slink_size = 0;
		zip->entry_uncompressed_limit = slink_size;
		zip->entry_compressed_size = slink_size;
		zip->entry_uncompressed_size = slink_size;
		zip->entry_crc32 = zip->crc32func(zip->entry_crc32,
		    (const unsigned char *)slink, slink_size);
		zip->entry_compression = COMPRESSION_STORE;
		version_needed = 20;
	} else if (type != AE_IFREG) {
		zip->entry_compression = COMPRESSION_STORE;
		zip->entry_uncompressed_limit = 0;
		size = 0;
		version_needed = 20;
	} else if (archive_entry_size_is_set(zip->entry)) {
		size = archive_entry_size(zip->entry);
		zip->entry_uncompressed_limit = size;
		zip->entry_compression = zip->requested_compression;
		if (zip->entry_compression == COMPRESSION_UNSPECIFIED) {
			zip->entry_compression = COMPRESSION_DEFAULT;
		}
		if (zip->entry_compression == COMPRESSION_STORE) {
			zip->entry_compressed_size = size;
			zip->entry_uncompressed_size = size;
			version_needed = 10;
		} else {
			zip->entry_uncompressed_size = size;
			version_needed = 20;
		}
		if ((zip->flags & ZIP_FLAG_FORCE_ZIP64) /* User asked. */
		    || (zip->entry_uncompressed_size > 0xffffffffLL)) { /* Large entry. */
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		}

		/* We may know the size, but never the CRC. */
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
	} else {
		/* Prefer deflate if it's available, because deflate
		 * has a clear end-of-data marker that makes
		 * length-at-end more reliable. */
		zip->entry_compression = COMPRESSION_DEFAULT;
		zip->entry_flags |= ZIP_ENTRY_FLAG_LENGTH_AT_END;
		if ((zip->flags & ZIP_FLAG_AVOID_ZIP64) == 0) {
			zip->entry_uses_zip64 = 1;
			version_needed = 45;
		} else if (zip->entry_compression == COMPRESSION_STORE) {
			version_needed = 10;
		} else {
			version_needed = 20;
		}
	}

	/* Format the local header. */
	memset(local_header, 0, sizeof(local_header));
	memcpy(local_header, "PK\003\004", 4);
	archive_le16enc(local_header + 4, version_needed);
	archive_le16enc(local_header + 6, zip->entry_flags);
	archive_le16enc(local_header + 8, zip->entry_compression);
	archive_le32enc(local_header + 10, dos_time(archive_entry_mtime(zip->entry)));
	archive_le32enc(local_header + 14, zip->entry_crc32);
	if (zip->entry_uses_zip64) {
		/* Zip64 data in the local header "must" include both
		 * compressed and uncompressed sizes AND those fields
		 * are included only if these are 0xffffffff;
		 * THEREFORE these must be set this way, even if we
		 * know one of them is smaller. */
		archive_le32enc(local_header + 18, 0xffffffffLL);
		archive_le32enc(local_header + 22, 0xffffffffLL);
	} else {
		archive_le32enc(local_header + 18, zip->entry_compressed_size);
		archive_le32enc(local_header + 22, zip->entry_uncompressed_size);
	}
	archive_le16enc(local_header + 26, filename_length);

	/* Format as much of central directory file header as we can: */
	zip->file_header = cd_alloc(zip, 46);
	/* If (zip->file_header == NULL) XXXX */
	++zip->central_directory_entries;
	memset(zip->file_header, 0, 46);
	memcpy(zip->file_header, "PK\001\002", 4);
	/* "Made by PKZip 2.0 on Unix." */
	archive_le16enc(zip->file_header + 4, 3 * 256 + version_needed);
	archive_le16enc(zip->file_header + 6, version_needed);
	archive_le16enc(zip->file_header + 8, zip->entry_flags);
	archive_le16enc(zip->file_header + 10, zip->entry_compression);
	archive_le32enc(zip->file_header + 12, dos_time(archive_entry_mtime(zip->entry)));
	archive_le16enc(zip->file_header + 28, filename_length);
	/* Following Info-Zip, store mode in the "external attributes" field. */
	archive_le32enc(zip->file_header + 38,
	    archive_entry_mode(zip->entry) << 16);
	e = cd_alloc(zip, filename_length);
	/* If (e == NULL) XXXX */
	copy_path(zip->entry, e);

	/* Format extra data. */
	memset(local_extra, 0, sizeof(local_extra));
	e = local_extra;

	/* First, extra blocks that are the same between
	 * the local file header and the central directory.
	 * We format them once and then duplicate them. */

	/* UT timestamp, length depends on what timestamps are set. */
	memcpy(e, "UT", 2);
	archive_le16enc(e + 2,
	    1
	    + (archive_entry_mtime_is_set(entry) ? 4 : 0)
	    + (archive_entry_atime_is_set(entry) ? 4 : 0)
	    + (archive_entry_ctime_is_set(entry) ? 4 : 0));
	e += 4;
	*e++ =
	    (archive_entry_mtime_is_set(entry) ? 1 : 0)
	    | (archive_entry_atime_is_set(entry) ? 2 : 0)
	    | (archive_entry_ctime_is_set(entry) ? 4 : 0);
	if (archive_entry_mtime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_mtime(entry));
		e += 4;
	}
	if (archive_entry_atime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_atime(entry));
		e += 4;
	}
	if (archive_entry_ctime_is_set(entry)) {
		archive_le32enc(e, (uint32_t)archive_entry_ctime(entry));
		e += 4;
	}

	/* ux Unix extra data, length 11, version 1 */
	/* TODO: If uid < 64k, use 2 bytes, ditto for gid. */
	memcpy(e, "ux\013\000\001", 5);
	e += 5;
	*e++ = 4; /* Length of following UID */
	archive_le32enc(e, (uint32_t)archive_entry_uid(entry));
	e += 4;
	*e++ = 4; /* Length of following GID */
	archive_le32enc(e, (uint32_t)archive_entry_gid(entry));
	e += 4;

	/* Copy UT and ux into central directory as well. */
	zip->file_header_extra_offset = zip->central_directory_bytes;
	cd_extra = cd_alloc(zip, e - local_extra);
	memcpy(cd_extra, local_extra, e - local_extra);

	/*
	 * Following extra blocks vary between local header and
	 * central directory. These are the local header versions.
	 * Central directory versions get formatted in
	 * archive_write_zip_finish_entry() below.
	 */

	/* "[Zip64 entry] in the local header MUST include BOTH
	 * original [uncompressed] and compressed size fields." */
	if (zip->entry_uses_zip64) {
		unsigned char *zip64_start = e;
		memcpy(e, "\001\000\020\000", 4);
		e += 4;
		archive_le64enc(e, zip->entry_uncompressed_size);
		e += 8;
		archive_le64enc(e, zip->entry_compressed_size);
		e += 8;
		archive_le16enc(zip64_start + 2, e - (zip64_start + 4));
	}

	if (zip->flags & ZIP_FLAG_EXPERIMENT_EL) {
		/* Experimental 'el' extension to improve streaming. */
		unsigned char *external_info = e;
		int included = 7;
		memcpy(e, "el\000\000", 4); // 0x6c65 + 2-byte length
		e += 4;
		e[0] = included; /* bitmap of included fields */
		e += 1;
		if (included & 1) {
			archive_le16enc(e, /* "Version created by" */
			    3 * 256 + version_needed);
			e += 2;
		}
		if (included & 2) {
			archive_le16enc(e, 0); /* internal file attributes */
			e += 2;
		}
		if (included & 4) {
			archive_le32enc(e,  /* external file attributes */
			    archive_entry_mode(zip->entry) << 16);
			e += 4;
		}
		if (included & 8) {
			// Libarchive does not currently support file comments.
		}
		archive_le16enc(external_info + 2, e - (external_info + 4));
	}

	/* Update local header with size of extra data and write it all out: */
	archive_le16enc(local_header + 28, e - local_extra);

	ret = __archive_write_output(a, local_header, 30);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += 30;

	ret = write_path(zip->entry, a);
	if (ret <= ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += ret;

	ret = __archive_write_output(a, local_extra, e - local_extra);
	if (ret != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	zip->written_bytes += e - local_extra;

	/* For symlinks, write the body now. */
	if (slink != NULL) {
		ret = __archive_write_output(a, slink, slink_size);
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
		zip->entry_compressed_written += slink_size;
		zip->entry_uncompressed_written += slink_size;
		zip->written_bytes += slink_size;
	}

#ifdef HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		zip->stream.zalloc = Z_NULL;
		zip->stream.zfree = Z_NULL;
		zip->stream.opaque = Z_NULL;
		zip->stream.next_out = zip->buf;
		zip->stream.avail_out = (uInt)zip->len_buf;
		if (deflateInit2(&zip->stream, Z_DEFAULT_COMPRESSION,
		    Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY) != Z_OK) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't init deflate compressor");
			return (ARCHIVE_FATAL);
		}
	}
#endif

	return (ret2);
}